

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::iterator::insert
          (iterator *this,unsigned_long left,unsigned_long right,Expression **value,
          allocator_type *alloc)

{
  Path *this_00;
  IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *this_01;
  int iVar1;
  uint32_t uVar2;
  uintptr_t intWord;
  IndexPair offset;
  size_type sVar3;
  pointer pEVar4;
  uint uVar5;
  uint level;
  interval<unsigned_long> ival;
  interval<unsigned_long> local_38;
  
  this_01 = (this->super_const_iterator).map;
  this_00 = &(this->super_const_iterator).path;
  local_38.left = left;
  local_38.right = right;
  if (this_01->height == 0) {
    uVar2 = IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Expression_*,_5U,_true>::
            insertFrom((LeafNode<unsigned_long,_const_slang::ast::Expression_*,_5U,_true> *)this_01,
                       (this->super_const_iterator).path.path.
                       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                       [(this->super_const_iterator).path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                       offset,this_01->rootSize,&local_38,value);
    if (uVar2 < 6) {
      this_01->rootSize = uVar2;
      ((this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->size =
           uVar2;
      return;
    }
    offset = IntervalMap<unsigned_long,slang::ast::Expression_const*,5u>::
             modifyRoot<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Expression_const*,5u,true>,slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Expression_const*,8u,false>,true>
                       ((IntervalMap<unsigned_long,slang::ast::Expression_const*,5u> *)this_01,
                        (LeafNode<unsigned_long,_const_slang::ast::Expression_*,_5U,_true> *)this_01
                        ,(this->super_const_iterator).path.path.
                         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                         [(this->super_const_iterator).path.path.
                          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                         offset,alloc);
    IntervalMapDetails::Path::
    replaceRoot<slang::IntervalMapDetails::BranchNode<unsigned_long,5u,true>>
              (this_00,(BranchNode<unsigned_long,_5U,_true> *)this_01,this_01->rootSize,offset);
  }
  sVar3 = (this->super_const_iterator).path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  if ((sVar3 == 0) ||
     (pEVar4 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar4->size <= pEVar4->offset)) {
    IntervalMapDetails::Path::legalizeForInsert(this_00,((this->super_const_iterator).map)->height);
    pEVar4 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    sVar3 = (this->super_const_iterator).path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  }
  uVar2 = IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Expression_*,_8U,_false>::
          insertFrom((LeafNode<unsigned_long,_const_slang::ast::Expression_*,_8U,_false> *)
                     pEVar4[sVar3 - 1].node,pEVar4[sVar3 - 1].offset,pEVar4[sVar3 - 1].size,
                     &local_38,value);
  if (8 < uVar2) {
    IntervalMap<unsigned_long,slang::ast::Expression_const*,5u>::iterator::
    overflow<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Expression_const*,8u,false>>
              ((iterator *)this,
               (int)(this->super_const_iterator).path.path.
                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1,alloc);
    pEVar4 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    sVar3 = (this->super_const_iterator).path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
    uVar2 = IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Expression_*,_8U,_false>::
            insertFrom((LeafNode<unsigned_long,_const_slang::ast::Expression_*,_8U,_false> *)
                       pEVar4[sVar3 - 1].node,pEVar4[sVar3 - 1].offset,pEVar4[sVar3 - 1].size,
                       &local_38,value);
  }
  pEVar4 = (this->super_const_iterator).path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  iVar1 = (int)(this->super_const_iterator).path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  level = iVar1 - 1;
  pEVar4[level].size = uVar2;
  if (level != 0) {
    uVar5 = iVar1 - 2;
    *(ulong *)((long)pEVar4[uVar5].node + (ulong)pEVar4[uVar5].offset * 8) =
         *(ulong *)((long)pEVar4[uVar5].node + (ulong)pEVar4[uVar5].offset * 8) & 0xffffffffffffffc0
         | (ulong)(uVar2 - 1);
  }
  updateParentBounds(this,level,&local_38);
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::insert(TKey left, TKey right, const TValue& value,
                                                    allocator_type& alloc) {
    using namespace IntervalMapDetails;

    auto& map = *this->map;
    auto& path = this->path;

    interval<TKey> ival{left, right};
    if (this->isFlat()) {
        // Try simple root leaf insert first.
        uint32_t size = map.rootLeaf.insertFrom(path.leafOffset(), map.rootSize, ival, value);
        if (size <= RootLeaf::Capacity) {
            map.rootSize = size;
            path.setSize(0, size);
            return;
        }

        // Root is full, we need to branch.
        auto offset = map.switchToBranch(path.leafOffset(), alloc);
        path.replaceRoot(&map.rootBranch, map.rootSize, offset);
    }

    if (!path.valid())
        path.legalizeForInsert(this->map->height);

    uint32_t size = path.leafSize();
    size = path.template leaf<Leaf>().insertFrom(path.leafOffset(), size, ival, value);

    if (size > Leaf::Capacity) {
        // If the new element didn't fit, overflow the node and try again.
        overflow<Leaf>(path.height(), alloc);
        size = path.template leaf<Leaf>().insertFrom(path.leafOffset(), path.leafSize(), ival,
                                                     value);
    }

    // Update path to match the newly inserted element.
    path.setSize(path.height(), size);
    updateParentBounds(path.height(), ival);
}